

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

Position aiBegin(char (*board) [15],int me)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (board[1][0] == '\0') {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    do {
      lVar4 = -0xf;
      uVar1 = 0;
      do {
        if (board[1][lVar4] == '\0') {
          uVar2 = uVar3 & 0xffffffff;
          goto LAB_00101206;
        }
        uVar1 = uVar1 + 0x100000000;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
      uVar3 = uVar3 + 1;
      board = board + 1;
    } while (uVar3 != 0xf);
  }
  uVar1 = 0;
LAB_00101206:
  return (Position)(uVar1 | uVar2);
}

Assistant:

struct Position aiBegin(const char board[BOARD_SIZE][BOARD_SIZE], int me) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    struct Position preferedPos = {0, 0};

    //for (i = 0; i < BOARD_SIZE; i++) {
    //    for (j = 0; j < BOARD_SIZE; j++) {
    //        if (EMPTY == board[i][j]) {
    //            preferedPos.x = i;
    //            preferedPos.y = j;
    //            return preferedPos;
    //        }
    //    }
    //}

    if (EMPTY == board[1][0]) {
      preferedPos.x = 1;
      preferedPos.y = 0;
    } else {
      for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
          if (EMPTY == board[i][j]) {
            preferedPos.x = i;
            preferedPos.y = j;
            return preferedPos;
          }
        }
      }
    }

    return preferedPos;
}